

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

bool __thiscall
QCommandLineParser::addOptions(QCommandLineParser *this,QList<QCommandLineOption> *options)

{
  bool bVar1;
  bool bVar2;
  QCommandLineOption *option;
  long lVar3;
  
  lVar3 = (options->d).size;
  if (lVar3 == 0) {
    bVar2 = true;
  }
  else {
    option = (options->d).ptr;
    lVar3 = lVar3 << 3;
    bVar2 = true;
    do {
      bVar1 = addOption(this,option);
      bVar2 = (bool)(bVar2 & bVar1);
      option = option + 1;
      lVar3 = lVar3 + -8;
    } while (lVar3 != 0);
  }
  return bVar2;
}

Assistant:

const T *constEnd() const noexcept { return data() + size; }